

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_directory_descriptor.c
# Opt level: O2

directory_descriptor directory_descriptor_create(directory_descriptor parent,char *path)

{
  directory_descriptor __ptr;
  vector pvVar1;
  
  __ptr = (directory_descriptor)malloc(0x210);
  if (__ptr != (directory_descriptor)0x0) {
    pvVar1 = (vector)vector_create(8);
    __ptr->files = pvVar1;
    if (pvVar1 != (vector)0x0) {
      __ptr->parent = parent;
      strncpy(__ptr->path,path,0x1ff);
      return __ptr;
    }
    log_write_impl_va("metacall",0x3a,"directory_descriptor_create",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/filesystem/source/filesystem_directory_descriptor.c"
                      ,3,"Directory descriptor invalid file allocation");
    free(__ptr);
  }
  return (directory_descriptor)0x0;
}

Assistant:

directory_descriptor directory_descriptor_create(directory_descriptor parent, const char *path)
{
	directory_descriptor d = malloc(sizeof(struct directory_descriptor_type));

	if (d != NULL)
	{
		d->files = vector_create(sizeof(file_descriptor));

		if (d->files == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Directory descriptor invalid file allocation");

			free(d);

			return NULL;
		}

		d->parent = parent;

		strncpy(d->path, path, DIRECTORY_DESCRIPTOR_PATH_SIZE - 1);

		return d;
	}

	return NULL;
}